

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_law_compression.cc
# Opt level: O0

void __thiscall
sptk::MuLawCompression::MuLawCompression
          (MuLawCompression *this,double abs_max_value,double compression_factor)

{
  double dVar1;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar2;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  
  *in_RDI = &PTR__MuLawCompression_00125cc8;
  in_RDI[1] = in_XMM0_Qa;
  in_RDI[2] = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  dVar1 = (double)in_RDI[1];
  dVar2 = log1p((double)in_RDI[2]);
  in_RDI[3] = dVar1 / dVar2;
  *(undefined1 *)(in_RDI + 4) = 1;
  if (((double)in_RDI[1] <= 0.0) || ((double)in_RDI[2] <= 0.0)) {
    *(undefined1 *)(in_RDI + 4) = 0;
  }
  return;
}

Assistant:

MuLawCompression::MuLawCompression(double abs_max_value,
                                   double compression_factor)
    : abs_max_value_(abs_max_value),
      compression_factor_(compression_factor),
      constant_(abs_max_value_ / std::log1p(compression_factor_)),
      is_valid_(true) {
  if (abs_max_value_ <= 0.0 || compression_factor_ <= 0.0) {
    is_valid_ = false;
    return;
  }
}